

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_func.h
# Opt level: O0

char * tvm::runtime::TypeCode2Str(int type_code)

{
  ostringstream *poVar1;
  ostream *this;
  LogMessageFatal local_1a0;
  int local_14;
  char *pcStack_10;
  int type_code_local;
  
  switch(type_code) {
  case 0:
    pcStack_10 = "int";
    break;
  case 1:
    pcStack_10 = "uint";
    break;
  case 2:
    pcStack_10 = "float";
    break;
  case 3:
    pcStack_10 = "handle";
    break;
  case 4:
    pcStack_10 = "NULL";
    break;
  case 5:
    pcStack_10 = "DLDataType";
    break;
  case 6:
    pcStack_10 = "TVMContext";
    break;
  case 7:
    pcStack_10 = "ArrayHandle";
    break;
  case 8:
    pcStack_10 = "Object";
    break;
  case 9:
    pcStack_10 = "ModuleHandle";
    break;
  case 10:
    pcStack_10 = "FunctionHandle";
    break;
  case 0xb:
    pcStack_10 = "str";
    break;
  case 0xc:
    pcStack_10 = "bytes";
    break;
  case 0xd:
    pcStack_10 = "NDArrayContainer";
    break;
  default:
    local_14 = type_code;
    dmlc::LogMessageFatal::LogMessageFatal
              (&local_1a0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/liueo[P]TVM-deploy/tvm/include/tvm/runtime/packed_func.h"
               ,0x3f6);
    poVar1 = dmlc::LogMessageFatal::stream_abi_cxx11_(&local_1a0);
    this = std::operator<<((ostream *)poVar1,"unknown type_code=");
    std::ostream::operator<<(this,local_14);
    dmlc::LogMessageFatal::~LogMessageFatal(&local_1a0);
    pcStack_10 = "";
  }
  return pcStack_10;
}

Assistant:

inline const char* TypeCode2Str(int type_code) {
  switch (type_code) {
    case kDLInt: return "int";
    case kDLUInt: return "uint";
    case kDLFloat: return "float";
    case kTVMStr: return "str";
    case kTVMBytes: return "bytes";
    case kTVMOpaqueHandle: return "handle";
    case kTVMNullptr: return "NULL";
    case kTVMDLTensorHandle: return "ArrayHandle";
    case kTVMDataType: return "DLDataType";
    case kTVMContext: return "TVMContext";
    case kTVMPackedFuncHandle: return "FunctionHandle";
    case kTVMModuleHandle: return "ModuleHandle";
    case kTVMNDArrayHandle: return "NDArrayContainer";
    case kTVMObjectHandle: return "Object";
    default: LOG(FATAL) << "unknown type_code="
                        << static_cast<int>(type_code); return "";
  }
}